

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void compact_int64_suite::fail_array8_int64_overflow(void)

{
  array<long,_1UL> value;
  value_type input [18];
  decoder decoder;
  undefined4 local_5c;
  size_type local_58 [2];
  uchar local_48 [24];
  decoder local_30;
  
  local_30.input._M_str = local_48;
  local_48[0] = 0xae;
  local_48[1] = '\x10';
  local_48[2] = '\x11';
  local_48[3] = '\"';
  local_48[4] = '3';
  local_48[5] = 'D';
  local_48[6] = 'U';
  local_48[7] = 'f';
  local_48[8] = 'w';
  local_48[9] = 0x88;
  local_48[10] = 0x99;
  local_48[0xb] = 0xaa;
  local_48[0xc] = 0xbb;
  local_48[0xd] = 0xcc;
  local_48[0xe] = 0xdd;
  local_48[0xf] = 0xee;
  local_48[0x10] = 0xff;
  local_48[0x11] = '\0';
  local_30.input._M_len = 0x12;
  local_30.current.view._M_len = 0;
  local_30.current.view._M_str = (uchar *)0x0;
  local_30.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_30);
  local_58[1] = 0;
  local_58[0] = trial::protocol::bintoken::detail::decoder::
                overloader<trial::protocol::bintoken::token::int64>::decode
                          (&local_30,(return_type *)(local_58 + 1),1);
  local_5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("decoder.array(value.data(), value.size())","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xae0,"void compact_int64_suite::fail_array8_int64_overflow()",local_58,&local_5c);
  return;
}

Assistant:

void fail_array8_int64_overflow()
{
    const value_type input[] = { token::code::array8_int64, 0x10, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88, 0x99, 0xAA, 0xBB, 0xCC, 0xDD, 0xEE, 0xFF, 0x00 };
    format::detail::decoder decoder(input);
    std::array<std::int64_t, 1> value = {};
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.array(value.data(), value.size()), 1);
}